

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O2

void __thiscall
Jupiter::GenericCommandNamespace::~GenericCommandNamespace(GenericCommandNamespace *this)

{
  (this->super_GenericCommand).super_Command._vptr_Command = (_func_int **)&PTR_getHelp_0015a228;
  std::__cxx11::string::~string((string *)&this->m_help);
  std::_Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::
  ~_Vector_base(&(this->m_commands).
                 super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
               );
  GenericCommand::~GenericCommand(&this->super_GenericCommand);
  return;
}

Assistant:

Jupiter::GenericCommandNamespace::~GenericCommandNamespace() {
}